

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unixClose(sqlite3_file *id)

{
  int iVar1;
  unixFile *in_RDI;
  unixInodeInfo *pInode;
  unixFile *pFile;
  int rc;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  unixFile *pFile_00;
  
  pFile_00 = (unixFile *)in_RDI->pInode;
  verifyDbFile((unixFile *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  unixUnlock((sqlite3_file *)pFile_00,in_stack_ffffffffffffffdc);
  unixEnterMutex();
  sqlite3_mutex_enter((sqlite3_mutex *)0x152fe6);
  if (*(int *)&pFile_00->eFileLock != 0) {
    setPendingFd(in_RDI);
  }
  sqlite3_mutex_leave((sqlite3_mutex *)0x153009);
  releaseInodeInfo(pFile_00);
  iVar1 = closeUnixFile((sqlite3_file *)pFile_00);
  unixLeaveMutex();
  return iVar1;
}

Assistant:

static int unixClose(sqlite3_file *id){
  int rc = SQLITE_OK;
  unixFile *pFile = (unixFile *)id;
  unixInodeInfo *pInode = pFile->pInode;

  assert( pInode!=0 );
  verifyDbFile(pFile);
  unixUnlock(id, NO_LOCK);
  assert( unixFileMutexNotheld(pFile) );
  unixEnterMutex();

  /* unixFile.pInode is always valid here. Otherwise, a different close
  ** routine (e.g. nolockClose()) would be called instead.
  */
  assert( pFile->pInode->nLock>0 || pFile->pInode->bProcessLock==0 );
  sqlite3_mutex_enter(pInode->pLockMutex);
  if( pInode->nLock ){
    /* If there are outstanding locks, do not actually close the file just
    ** yet because that would clear those locks.  Instead, add the file
    ** descriptor to pInode->pUnused list.  It will be automatically closed
    ** when the last lock is cleared.
    */
    setPendingFd(pFile);
  }
  sqlite3_mutex_leave(pInode->pLockMutex);
  releaseInodeInfo(pFile);
  assert( pFile->pShm==0 );
  rc = closeUnixFile(id);
  unixLeaveMutex();
  return rc;
}